

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void __thiscall cubeb_resampler_one_way_Test::TestBody(cubeb_resampler_one_way_Test *this)

{
  uint32_t chunk_duration;
  uint32_t dest_rate;
  uint32_t source_rate;
  uint32_t channels;
  float in_stack_00000198;
  uint32_t in_stack_0000019c;
  uint32_t in_stack_000001a0;
  uint32_t in_stack_000001a4;
  uint local_18;
  uint local_14;
  uint local_10;
  uint local_c;
  
  for (local_c = 1; local_c < 3; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 3; local_10 = local_10 + 1) {
      for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
        for (local_18 = 10; local_18 < 0x1e; local_18 = local_18 + 10) {
          fprintf(_stderr,
                  "one_way: channels: %d, source_rate: %d, dest_rate: %d, chunk_duration: %d\n",
                  (ulong)local_c,(ulong)sample_rates[local_10],(ulong)sample_rates[local_14],
                  (ulong)local_18);
          test_resampler_one_way<float>
                    (in_stack_000001a4,in_stack_000001a0,in_stack_0000019c,in_stack_00000198);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(cubeb, resampler_one_way)
{
  /* Test one way resamplers */
  for (uint32_t channels = 1; channels <= max_channels; channels++) {
    for (uint32_t source_rate = 0; source_rate < array_size(sample_rates);
         source_rate++) {
      for (uint32_t dest_rate = 0; dest_rate < array_size(sample_rates);
           dest_rate++) {
        for (uint32_t chunk_duration = min_chunks; chunk_duration < max_chunks;
             chunk_duration += chunk_increment) {
          fprintf(stderr,
                  "one_way: channels: %d, source_rate: %d, dest_rate: %d, "
                  "chunk_duration: %d\n",
                  channels, sample_rates[source_rate], sample_rates[dest_rate],
                  chunk_duration);
          test_resampler_one_way<float>(channels, sample_rates[source_rate],
                                        sample_rates[dest_rate],
                                        chunk_duration);
        }
      }
    }
  }
}